

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ushort uVar4;
  __m256i *in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *above_00;
  uint8_t *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m256i l16;
  __m256i rep;
  __m256i l;
  int i;
  __m256i one;
  __m256i tl;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  undefined8 local_3c0;
  undefined8 uStackY_3b8;
  undefined8 local_3b0;
  undefined8 uStackY_3a8;
  undefined8 local_3a0;
  undefined8 uStackY_398;
  undefined8 local_390;
  undefined8 uStackY_388;
  undefined1 auVar11 [24];
  undefined1 local_360 [32];
  int local_304;
  uint8_t *local_228;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  above_00 = in_RSI;
  get_top_vector(in_RDX,in_RSI);
  get_top_vector((__m256i *)(*in_RDX + 2),above_00);
  get_top_vector(in_RDX + 1,above_00);
  get_top_vector((__m256i *)(in_RDX[1] + 2),above_00);
  uVar4 = (ushort)*(byte *)((long)in_RDX[-1] + 0x1f);
  auVar1 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,6);
  vpinsrw_avx(auVar1,(uint)uVar4,7);
  auVar1 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar4,6);
  vpinsrw_avx(auVar1,(uint)uVar4,7);
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar7 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar7 = vpinsrw_avx(auVar7,1,2);
  auVar7 = vpinsrw_avx(auVar7,1,3);
  auVar7 = vpinsrw_avx(auVar7,1,4);
  auVar7 = vpinsrw_avx(auVar7,1,5);
  auVar7 = vpinsrw_avx(auVar7,1,6);
  auVar7 = vpinsrw_avx(auVar7,1,7);
  local_c0 = auVar1._0_8_;
  uStack_b8 = auVar1._8_8_;
  uStack_b0 = auVar7._0_8_;
  uStack_a8 = auVar7._8_8_;
  uVar8 = uStack_b0;
  uVar10 = uStack_a8;
  get_left_vector(in_RCX,above_00);
  auVar7 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar7 = vpinsrw_avx(auVar7,0x8000,2);
  auVar7 = vpinsrw_avx(auVar7,0x8000,3);
  auVar7 = vpinsrw_avx(auVar7,0x8000,4);
  auVar7 = vpinsrw_avx(auVar7,0x8000,5);
  auVar7 = vpinsrw_avx(auVar7,0x8000,6);
  auVar7 = vpinsrw_avx(auVar7,0x8000,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar6 = vpinsrw_avx(auVar6,0x8000,2);
  auVar6 = vpinsrw_avx(auVar6,0x8000,3);
  auVar6 = vpinsrw_avx(auVar6,0x8000,4);
  auVar6 = vpinsrw_avx(auVar6,0x8000,5);
  auVar6 = vpinsrw_avx(auVar6,0x8000,6);
  auVar6 = vpinsrw_avx(auVar6,0x8000,7);
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  uStack_70 = auVar9._0_8_;
  uStack_68 = auVar9._8_8_;
  local_360._16_8_ = uStack_70;
  local_360._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar6;
  local_360._24_8_ = uStack_68;
  local_228 = in_RDI;
  for (local_304 = 0; local_304 < 0x10; local_304 = local_304 + 1) {
    auVar3._8_8_ = uStack_b8;
    auVar3._0_8_ = local_c0;
    auVar3._16_8_ = uVar8;
    auVar3._24_8_ = uVar10;
    auVar2 = vpshufb_avx2(auVar3,local_360);
    auVar11 = auVar2._0_24_;
    auVar5 = auVar2._0_16_;
    paeth_16x1_pred(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
    auVar9 = auVar5;
    paeth_16x1_pred(auVar11._16_8_,auVar11._8_8_,auVar11._0_8_);
    auVar6 = auVar9;
    paeth_16x1_pred(auVar11._16_8_,auVar11._8_8_,auVar11._0_8_);
    auVar7 = auVar6;
    paeth_16x1_pred(auVar11._16_8_,auVar11._8_8_,auVar11._0_8_);
    local_390 = auVar5._0_8_;
    uStackY_388 = auVar5._8_8_;
    *(undefined8 *)local_228 = local_390;
    *(undefined8 *)(local_228 + 8) = uStackY_388;
    local_3a0 = auVar9._0_8_;
    uStackY_398 = auVar9._8_8_;
    *(undefined8 *)(local_228 + 0x10) = local_3a0;
    *(undefined8 *)(local_228 + 0x18) = uStackY_398;
    local_3b0 = auVar6._0_8_;
    uStackY_3a8 = auVar6._8_8_;
    *(undefined8 *)(local_228 + 0x20) = local_3b0;
    *(undefined8 *)(local_228 + 0x28) = uStackY_3a8;
    local_3c0 = auVar7._0_8_;
    uStackY_3b8 = auVar7._8_8_;
    *(undefined8 *)(local_228 + 0x30) = local_3c0;
    *(undefined8 *)(local_228 + 0x38) = uStackY_3b8;
    local_228 = in_RSI + (long)local_228;
    auVar2._16_8_ = uStack_b0;
    auVar2._0_16_ = auVar1;
    auVar2._24_8_ = uStack_a8;
    local_360 = vpaddw_avx2(local_360,auVar2);
  }
  return;
}

Assistant:

void aom_paeth_predictor_64x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i t2 = get_top_vector(above + 32);
  const __m256i t3 = get_top_vector(above + 48);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  const __m256i l = get_left_vector(left);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);
    const __m128i r2 = paeth_16x1_pred(&l16, &t2, &tl);
    const __m128i r3 = paeth_16x1_pred(&l16, &t3, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}